

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecordUsageCache.cpp
# Opt level: O1

PolymorphicInlineCache * __thiscall
Js::PropertyRecordUsageCache::CreateBiggerPolymorphicInlineCache
          (PropertyRecordUsageCache *this,bool isLdElem)

{
  uint16 currentSize;
  PolymorphicInlineCache *this_00;
  code *pcVar1;
  bool bVar2;
  uint16 size;
  int iVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  ScriptContextPolymorphicInlineCache *clone;
  Type *addr;
  
  this_00 = (&this->ldElemInlineCache)[(ulong)isLdElem ^ 1].ptr;
  iVar3 = (*(this_00->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(this_00);
  if (0x1f < this_00->size) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/PropertyRecordUsageCache.cpp"
                                ,0x39,
                                "(polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger())"
                                ,
                                "polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger()"
                               );
    if (!bVar2) goto LAB_00d4a8a7;
    *puVar4 = 0;
  }
  currentSize = this_00->size;
  size = PolymorphicInlineCache::GetNextSize(currentSize);
  if (size <= currentSize) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/PropertyRecordUsageCache.cpp"
                                ,0x3c,"(newPolymorphicInlineCacheSize > polymorphicInlineCacheSize)"
                                ,"newPolymorphicInlineCacheSize > polymorphicInlineCacheSize");
    if (!bVar2) {
LAB_00d4a8a7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  clone = ScriptContextPolymorphicInlineCache::New
                    (size,(((ScriptContext *)CONCAT44(extraout_var,iVar3))->super_ScriptContextBase)
                          .javascriptLibrary);
  PolymorphicInlineCache::CopyTo
            (this_00,((this->propertyRecord).ptr)->pid,(ScriptContext *)CONCAT44(extraout_var,iVar3)
             ,&clone->super_PolymorphicInlineCache);
  addr = &this->ldElemInlineCache + ((ulong)isLdElem ^ 1);
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = &clone->super_PolymorphicInlineCache;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,PolymorphicInlineCachePhase);
  if (((!bVar2) || (DAT_015d346a == '\0')) &&
     (bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,PropertyCachePhase), !bVar2)) {
    return &clone->super_PolymorphicInlineCache;
  }
  Output::Print(L"PropertyRecordUsageCache \'%s\' : Bigger PIC, oldSize = %d, newSize = %d\n",
                (this->propertyRecord).ptr + 1,(ulong)currentSize,(ulong)size);
  return &clone->super_PolymorphicInlineCache;
}

Assistant:

PolymorphicInlineCache * PropertyRecordUsageCache::CreateBiggerPolymorphicInlineCache(bool isLdElem)
    {
        PolymorphicInlineCache * polymorphicInlineCache = isLdElem ? GetLdElemInlineCache() : GetStElemInlineCache();
        ScriptContext * scriptContext = polymorphicInlineCache->GetScriptContext();
        Assert(polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger());
        uint16 polymorphicInlineCacheSize = polymorphicInlineCache->GetSize();
        uint16 newPolymorphicInlineCacheSize = PolymorphicInlineCache::GetNextSize(polymorphicInlineCacheSize);
        Assert(newPolymorphicInlineCacheSize > polymorphicInlineCacheSize);
        PolymorphicInlineCache * newPolymorphicInlineCache = ScriptContextPolymorphicInlineCache::New(newPolymorphicInlineCacheSize, scriptContext->GetLibrary());
        polymorphicInlineCache->CopyTo(this->propertyRecord->GetPropertyId(), scriptContext, newPolymorphicInlineCache);
        if (isLdElem)
        {
            this->ldElemInlineCache = newPolymorphicInlineCache;
        }
        else
        {
            this->stElemInlineCache = newPolymorphicInlineCache;
        }
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase) || PHASE_TRACE1(PropertyCachePhase))
        {
            Output::Print(_u("PropertyRecordUsageCache '%s' : Bigger PIC, oldSize = %d, newSize = %d\n"), GetString(), polymorphicInlineCacheSize, newPolymorphicInlineCacheSize);
        }
#endif
        return newPolymorphicInlineCache;
    }